

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O0

bool HasGenericProperty<std::__cxx11::string>
               (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *list,char *szName)

{
  bool bVar1;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  uint32_t hash;
  char *szName_local;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *list_local;
  
  if (szName != (char *)0x0) {
    it._M_node._4_4_ = SuperFastHash(szName,0,0);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(list,(key_type *)((long)&it._M_node + 4));
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(list);
    bVar1 = std::operator==(&local_30,&local_38);
    list_local._7_1_ = !bVar1;
    return list_local._7_1_;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/GenericProperty.h"
                ,0x7f,
                "bool HasGenericProperty(const std::map<unsigned int, T> &, const char *) [T = std::basic_string<char>]"
               );
}

Assistant:

inline
bool HasGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return false;
    }

    return true;
}